

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::RegisterTypeParameterizedTestSuite
               (char *test_suite_name,CodeLocation *code_location)

{
  UnitTestImpl *pUVar1;
  CodeLocation CStack_48;
  
  pUVar1 = GetUnitTestImpl();
  CodeLocation::CodeLocation(&CStack_48,code_location);
  TypeParameterizedTestSuiteRegistry::RegisterTestSuite
            (&pUVar1->type_parameterized_test_registry_,test_suite_name,&CStack_48);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void RegisterTypeParameterizedTestSuite(const char* test_suite_name,
                                        CodeLocation code_location) {
  GetUnitTestImpl()->type_parameterized_test_registry().RegisterTestSuite(
      test_suite_name, std::move(code_location));
}